

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_load.c
# Opt level: O1

int cfgSet(void *ptr,mpt_path *p,mpt_value *val,int last,int curr)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((((~curr & 3U) == 0) && (iVar1 = (**(code **)(**ptr + 8))(), iVar1 < 0)) &&
     (iVar2 = iVar1, *(mpt_logger **)((long)ptr + 8) != (mpt_logger *)0x0)) {
    mpt_log(*(mpt_logger **)((long)ptr + 8),*(char **)((long)ptr + 0x10),3,"%s",
            "failed to set global config element");
  }
  return iVar2;
}

Assistant:

static int cfgSet(void *ptr, const MPT_STRUCT(path) *p, const MPT_STRUCT(value) *val, int last, int curr)
{
	struct loadCtx *ctx = ptr;
	MPT_INTERFACE(config) *cfg;
	
	if ((curr & 0x3) != MPT_PARSEFLAG(Option)) {
		return 0;
	}
	cfg = ctx->cfg;
	if ((last = cfg->_vptr->assign(cfg, p, val)) < 0) {
		if (ctx->log) {
			mpt_log(ctx->log, ctx->fcn, MPT_LOG(Error), "%s",
			        MPT_tr("failed to set global config element"));
		}
		return last;
	}
	return 0;
}